

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O0

uint32_t arm_ror(status_register_t *cpsr,uint32_t data,uint32_t shift_amount)

{
  byte bVar1;
  uint32_t result;
  uint32_t shift_amount_local;
  uint32_t data_local;
  status_register_t *cpsr_local;
  uint local_4;
  
  local_4 = data;
  if ((shift_amount != 0) &&
     (bVar1 = (byte)shift_amount & 0x1f, local_4 = data >> bVar1 | data << (-bVar1 & 0x1f),
     cpsr != (status_register_t *)0x0)) {
    cpsr->raw = cpsr->raw & 0xdfffffff | (uint)((int)local_4 < 0) << 0x1d;
  }
  return local_4;
}

Assistant:

word arm_ror(status_register_t* cpsr, word data, word shift_amount) {
    if (shift_amount == 0) {
        return data;
    }

    shift_amount &= 31u;
    word result = (data >> shift_amount) | (data << (-shift_amount & 31u));
    if (cpsr) cpsr->C = result >> 31u;
    return result;
}